

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O2

Pdr_Set_t * Pdr_SetCreate(Vec_Int_t *vLits,Vec_Int_t *vPiLits)

{
  int iVar1;
  int iVar2;
  Pdr_Set_t *pPVar3;
  long lVar4;
  ulong uVar5;
  
  iVar2 = vLits->nSize;
  lVar4 = (long)vPiLits->nSize + (long)iVar2;
  iVar1 = (int)lVar4;
  if (iVar1 < 0x40000000) {
    pPVar3 = (Pdr_Set_t *)malloc(lVar4 * 4 + 0x18);
    pPVar3->nLits = iVar2;
    pPVar3->nTotal = iVar1;
    pPVar3->nRefs = 1;
    pPVar3->Sign = 0;
    uVar5 = 0;
    for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      iVar1 = Vec_IntEntry(vLits,(int)lVar4);
      *(int *)(&pPVar3->field_0x14 + lVar4 * 4) = iVar1;
      uVar5 = uVar5 | 1L << ((long)iVar1 % 0x3f & 0x3fU);
      pPVar3->Sign = uVar5;
    }
    Vec_IntSelectSort((int *)&pPVar3->field_0x14,iVar2);
    for (lVar4 = (long)pPVar3->nLits; lVar4 < pPVar3->nTotal; lVar4 = lVar4 + 1) {
      iVar2 = Vec_IntEntry(vPiLits,(int)lVar4 - pPVar3->nLits);
      *(int *)(&pPVar3->field_0x14 + lVar4 * 4) = iVar2;
    }
    return pPVar3;
  }
  __assert_fail("Vec_IntSize(vLits) + Vec_IntSize(vPiLits) < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrUtil.c"
                ,0x45,"Pdr_Set_t *Pdr_SetCreate(Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Pdr_Set_t * Pdr_SetCreate( Vec_Int_t * vLits, Vec_Int_t * vPiLits )
{
    Pdr_Set_t * p;
    int i;
    assert( Vec_IntSize(vLits) + Vec_IntSize(vPiLits) < (1<<30) );
    p = (Pdr_Set_t *)ABC_ALLOC( char, sizeof(Pdr_Set_t) + (Vec_IntSize(vLits) + Vec_IntSize(vPiLits)) * sizeof(int) );
    p->nLits  = Vec_IntSize(vLits);
    p->nTotal = Vec_IntSize(vLits) + Vec_IntSize(vPiLits);
    p->nRefs  = 1;
    p->Sign   = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        p->Lits[i] = Vec_IntEntry(vLits, i);
        p->Sign   |= ((word)1 << (p->Lits[i] % 63));
    }
    Vec_IntSelectSort( p->Lits, p->nLits );
    // remember PI literals 
    for ( i = p->nLits; i < p->nTotal; i++ )
        p->Lits[i] = Vec_IntEntry(vPiLits, i-p->nLits);
    return p;
}